

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_jh.c
# Opt level: O3

void F8(hashState *state)

{
  uint64 *puVar1;
  undefined4 uVar2;
  bool bVar3;
  uint64 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64 (*pauVar10) [2];
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  
  uVar5 = 0;
  do {
    puVar1 = state->x[0] + (uVar5 & 0xfffffffffffffffe) + (ulong)((uint)uVar5 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar5 * 8);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  uVar5 = 0;
  do {
    lVar14 = uVar5 * 0x20;
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar16 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ecd0 + lVar18 * 8);
      uVar6 = ~uVar17 & *(ulong *)(E8_bitslice_roundconstant[uVar5] + lVar18 * 8) ^
              state->x[0][lVar18];
      uVar9 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar9 & uVar11 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar8 = state->x[2][lVar18];
      uVar12 = state->x[3][lVar18];
      uVar13 = uVar8 & uVar6 ^ *(ulong *)(E8_bitslice_roundconstant[uVar5] + lVar18 * 8);
      uVar11 = uVar12 & uVar20 ^ uVar11;
      uVar6 = uVar17 & uVar16 ^ uVar6;
      uVar20 = uVar9 & uVar19 ^ uVar20;
      uVar7 = uVar6 & uVar17 ^ uVar8;
      uVar16 = uVar16 ^ ~uVar8 & uVar17;
      uVar17 = (~uVar8 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar6 ^ uVar17;
      uVar15 = uVar20 & uVar9 ^ uVar12;
      uVar19 = uVar19 ^ ~uVar12 & uVar9;
      uVar9 = (~uVar12 & uVar9 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar9;
      uVar12 = uVar17 & uVar7 ^ uVar16;
      uVar6 = (uVar16 | uVar7) ^ uVar6;
      uVar20 = (uVar19 | uVar15) ^ uVar20;
      uVar7 = uVar6 & uVar13 ^ uVar7;
      uVar17 = uVar17 ^ uVar13;
      uVar8 = uVar7 ^ uVar20;
      uVar13 = uVar15 ^ uVar17 ^ uVar20 & uVar11;
      uVar15 = uVar9 & uVar15 ^ uVar19 ^ uVar6;
      state->x[0][lVar18] = uVar6 ^ uVar13;
      uVar11 = uVar9 ^ uVar11 ^ uVar6 ^ uVar12;
      state->x[2][lVar18] = uVar7 ^ uVar11;
      state->x[4][lVar18] = uVar17 ^ uVar15 ^ uVar8;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar8;
      state->x[1][lVar18] = uVar8 >> 1 & 0x5555555555555555 | uVar8 * 2 & 0xaaaaaaaaaaaaaaaa;
      state->x[3][lVar18] = uVar13 >> 1 & 0x5555555555555555 | uVar13 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) =
           uVar11 >> 1 & 0x5555555555555555 | uVar11 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) =
           uVar15 >> 1 & 0x5555555555555555 | uVar15 * 2 & 0xaaaaaaaaaaaaaaaa;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar16 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ece0 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ecf0 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar20 ^ uVar9;
      uVar7 = uVar17 & uVar16 ^ uVar7;
      uVar20 = uVar8 & uVar19 ^ uVar20;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar16 = uVar16 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar15 = uVar20 & uVar8 ^ uVar6;
      uVar19 = uVar19 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar8;
      uVar12 = uVar17 & uVar13 ^ uVar16;
      uVar7 = (uVar16 | uVar13) ^ uVar7;
      uVar20 = (uVar19 | uVar15) ^ uVar20;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar20;
      uVar6 = uVar15 ^ uVar17 ^ uVar20 & uVar9;
      uVar15 = uVar8 & uVar15 ^ uVar19 ^ uVar7;
      state->x[0][lVar18] = uVar7 ^ uVar6;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar12;
      state->x[2][lVar18] = uVar13 ^ uVar9;
      state->x[4][lVar18] = uVar17 ^ uVar15 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar11;
      state->x[1][lVar18] = uVar11 >> 2 & 0x3333333333333333 | uVar11 * 4 & 0xcccccccccccccccc;
      state->x[3][lVar18] = uVar6 >> 2 & 0x3333333333333333 | uVar6 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) =
           uVar9 >> 2 & 0x3333333333333333 | uVar9 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) =
           uVar15 >> 2 & 0x3333333333333333 | uVar15 * 4 & 0xcccccccccccccccc;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar16 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ed00 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ed10 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar20 ^ uVar9;
      uVar7 = uVar17 & uVar16 ^ uVar7;
      uVar20 = uVar8 & uVar19 ^ uVar20;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar16 = uVar16 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar15 = uVar20 & uVar8 ^ uVar6;
      uVar19 = uVar19 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar8;
      uVar12 = uVar17 & uVar13 ^ uVar16;
      uVar7 = (uVar16 | uVar13) ^ uVar7;
      uVar20 = (uVar19 | uVar15) ^ uVar20;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar20;
      uVar6 = uVar15 ^ uVar17 ^ uVar20 & uVar9;
      uVar15 = uVar8 & uVar15 ^ uVar19 ^ uVar7;
      state->x[0][lVar18] = uVar7 ^ uVar6;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar12;
      state->x[2][lVar18] = uVar13 ^ uVar9;
      state->x[4][lVar18] = uVar17 ^ uVar15 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar11;
      state->x[1][lVar18] = uVar11 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar11 & 0xf0f0f0f0f0f0f0f) << 4;
      state->x[3][lVar18] = uVar6 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar6 & 0xf0f0f0f0f0f0f0f) << 4;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) =
           uVar9 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar9 & 0xf0f0f0f0f0f0f0f) << 4;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) =
           uVar15 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar15 & 0xf0f0f0f0f0f0f0f) << 4;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar16 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ed20 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ed30 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar20 ^ uVar9;
      uVar7 = uVar17 & uVar16 ^ uVar7;
      uVar20 = uVar8 & uVar19 ^ uVar20;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar16 = uVar16 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar15 = uVar20 & uVar8 ^ uVar6;
      uVar19 = uVar19 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar8;
      uVar12 = uVar17 & uVar13 ^ uVar16;
      uVar7 = (uVar16 | uVar13) ^ uVar7;
      uVar20 = (uVar19 | uVar15) ^ uVar20;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar20;
      uVar6 = uVar15 ^ uVar17 ^ uVar20 & uVar9;
      uVar15 = uVar8 & uVar15 ^ uVar19 ^ uVar7;
      state->x[0][lVar18] = uVar7 ^ uVar6;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar12;
      state->x[2][lVar18] = uVar13 ^ uVar9;
      state->x[4][lVar18] = uVar17 ^ uVar15 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar11;
      state->x[1][lVar18] = uVar11 >> 8 & 0xff00ff00ff00ff | (uVar11 & 0xff00ff00ff00ff) << 8;
      state->x[3][lVar18] = uVar6 >> 8 & 0xff00ff00ff00ff | (uVar6 & 0xff00ff00ff00ff) << 8;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) =
           uVar9 >> 8 & 0xff00ff00ff00ff | (uVar9 & 0xff00ff00ff00ff) << 8;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) =
           uVar15 >> 8 & 0xff00ff00ff00ff | (uVar15 & 0xff00ff00ff00ff) << 8;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar16 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ed40 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ed50 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar20 ^ uVar9;
      uVar7 = uVar17 & uVar16 ^ uVar7;
      uVar20 = uVar8 & uVar19 ^ uVar20;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar16 = uVar16 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar15 = uVar20 & uVar8 ^ uVar6;
      uVar19 = uVar19 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar8;
      uVar12 = uVar17 & uVar13 ^ uVar16;
      uVar7 = (uVar16 | uVar13) ^ uVar7;
      uVar20 = (uVar19 | uVar15) ^ uVar20;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar20;
      uVar6 = uVar15 ^ uVar17 ^ uVar20 & uVar9;
      uVar15 = uVar8 & uVar15 ^ uVar19 ^ uVar7;
      state->x[0][lVar18] = uVar7 ^ uVar6;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar12;
      state->x[2][lVar18] = uVar13 ^ uVar9;
      state->x[4][lVar18] = uVar17 ^ uVar15 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar11;
      state->x[1][lVar18] = uVar11 >> 0x10 & 0xffff0000ffff | (uVar11 & 0xffff0000ffff) << 0x10;
      state->x[3][lVar18] = uVar6 >> 0x10 & 0xffff0000ffff | (uVar6 & 0xffff0000ffff) << 0x10;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) =
           uVar9 >> 0x10 & 0xffff0000ffff | (uVar9 & 0xffff0000ffff) << 0x10;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) =
           uVar15 >> 0x10 & 0xffff0000ffff | (uVar15 & 0xffff0000ffff) << 0x10;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar15 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ed60 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ed70 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar20 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar19 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar20 ^ uVar9;
      uVar7 = uVar17 & uVar15 ^ uVar7;
      uVar20 = uVar8 & uVar19 ^ uVar20;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar15 = uVar15 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar16 = uVar20 & uVar8 ^ uVar6;
      uVar19 = uVar19 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar20 ^ uVar8;
      uVar12 = uVar17 & uVar13 ^ uVar15;
      uVar7 = (uVar15 | uVar13) ^ uVar7;
      uVar20 = (uVar19 | uVar16) ^ uVar20;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar20;
      uVar15 = uVar16 ^ uVar17 ^ uVar20 & uVar9;
      uVar6 = uVar8 & uVar16 ^ uVar19 ^ uVar7;
      state->x[0][lVar18] = uVar7 ^ uVar15;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar12;
      state->x[2][lVar18] = uVar13 ^ uVar9;
      state->x[4][lVar18] = uVar17 ^ uVar6 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar12 ^ uVar11;
      state->x[1][lVar18] = uVar11 << 0x20 | uVar11 >> 0x20;
      state->x[3][lVar18] = uVar15 << 0x20 | uVar15 >> 0x20;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) = uVar9 << 0x20 | uVar9 >> 0x20;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) = uVar6 << 0x20 | uVar6 >> 0x20;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    lVar18 = 0;
    bVar21 = true;
    do {
      bVar3 = bVar21;
      uVar15 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x20);
      uVar17 = state->x[4][lVar18];
      uVar11 = *(ulong *)(lVar14 + 0x18ed80 + lVar18 * 8);
      uVar9 = *(ulong *)(lVar14 + 0x18ed90 + lVar18 * 8);
      uVar7 = ~uVar17 & uVar11 ^ state->x[0][lVar18];
      uVar8 = *(ulong *)(state->buffer + lVar18 * 8 + -0x30);
      uVar16 = ~uVar8 & uVar9 ^ state->x[1][lVar18];
      uVar20 = ~*(ulong *)(state->buffer + lVar18 * 8 + -0x10);
      uVar12 = state->x[2][lVar18];
      uVar6 = state->x[3][lVar18];
      uVar11 = uVar12 & uVar7 ^ uVar11;
      uVar9 = uVar6 & uVar16 ^ uVar9;
      uVar7 = uVar17 & uVar15 ^ uVar7;
      uVar16 = uVar8 & uVar20 ^ uVar16;
      uVar13 = uVar7 & uVar17 ^ uVar12;
      uVar15 = uVar15 ^ ~uVar12 & uVar17;
      uVar17 = (~uVar12 & uVar17 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x20)) & uVar7 ^ uVar17;
      uVar12 = uVar16 & uVar8 ^ uVar6;
      uVar20 = uVar20 ^ ~uVar6 & uVar8;
      uVar8 = (~uVar6 & uVar8 ^ *(ulong *)(state->buffer + lVar18 * 8 + -0x10)) & uVar16 ^ uVar8;
      uVar19 = uVar17 & uVar13 ^ uVar15;
      uVar7 = (uVar15 | uVar13) ^ uVar7;
      uVar16 = (uVar20 | uVar12) ^ uVar16;
      uVar13 = uVar7 & uVar11 ^ uVar13;
      uVar17 = uVar17 ^ uVar11;
      uVar11 = uVar13 ^ uVar16;
      uVar6 = uVar12 ^ uVar17 ^ uVar16 & uVar9;
      state->x[1][lVar18] = uVar11;
      state->x[3][lVar18] = uVar6;
      uVar12 = uVar8 & uVar12 ^ uVar20 ^ uVar7;
      uVar9 = uVar8 ^ uVar9 ^ uVar7 ^ uVar19;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x30) = uVar9;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x10) = uVar12;
      state->x[0][lVar18] = uVar6 ^ uVar7;
      state->x[2][lVar18] = uVar9 ^ uVar13;
      state->x[4][lVar18] = uVar12 ^ uVar17 ^ uVar11;
      *(ulong *)(state->buffer + lVar18 * 8 + -0x20) = uVar11 ^ uVar19;
      lVar18 = 1;
      bVar21 = false;
    } while (bVar3);
    uVar17 = 0xffffffffffffffff;
    pauVar10 = state->x + 1;
    do {
      uVar4 = (*pauVar10)[0];
      uVar2 = *(undefined4 *)((long)*pauVar10 + 4);
      *(int *)*pauVar10 = (int)(*pauVar10)[1];
      *(undefined4 *)((long)*pauVar10 + 4) = uVar2;
      *(int *)(*pauVar10 + 1) = (int)uVar4;
      *(undefined4 *)((long)*pauVar10 + 0xc) = uVar2;
      uVar17 = uVar17 + 2;
      pauVar10 = pauVar10 + 2;
    } while (uVar17 < 6);
    bVar21 = uVar5 < 0x23;
    uVar5 = uVar5 + 7;
  } while (bVar21);
  uVar5 = 0;
  do {
    puVar1 = state->x[4] + (uVar5 & 0xfffffffffffffffe) + (ulong)((uint)uVar5 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar5 * 8);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  return;
}

Assistant:

static void F8(hashState *state)
{
      uint64  i;

      /*xor the 512-bit message with the fist half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[i >> 1][i & 1] ^= ((uint64*)state->buffer)[i];

      /*the bijective function E8 */
      E8(state);

      /*xor the 512-bit message with the second half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[(8+i) >> 1][(8+i) & 1] ^= ((uint64*)state->buffer)[i];
}